

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O1

int asn1_item_ex_d2i(ASN1_VALUE **pval,uchar **in,long len,ASN1_ITEM *it,int tag,int aclass,char opt
                    ,CRYPTO_BUFFER *buf,int depth)

{
  ASN1_TEMPLATE *pAVar1;
  bool bVar2;
  uchar **ppuVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint8_t *puVar7;
  size_t sVar8;
  ASN1_VALUE **ppAVar9;
  ulong uVar10;
  ASN1_TEMPLATE *pAVar11;
  ASN1_TEMPLATE *pAVar12;
  ASN1_VALUE **ppAVar13;
  long lVar14;
  code *pcVar15;
  byte opt_00;
  uint8_t *puVar16;
  ASN1_TEMPLATE *pAVar17;
  int iVar18;
  uchar oclass;
  uchar *p;
  char cst;
  uchar local_79;
  code *local_78;
  uchar **local_70;
  code *local_68;
  ASN1_VALUE **local_60;
  int local_58;
  int local_54;
  code *local_50;
  ASN1_VALUE **local_48;
  CRYPTO_BUFFER *local_40;
  code *local_38;
  
  local_68 = (code *)0x0;
  if (pval == (ASN1_VALUE **)0x0) {
    return 0;
  }
  local_70 = (uchar **)CONCAT44(local_70._4_4_,tag);
  local_50 = (code *)CONCAT44(local_50._4_4_,aclass);
  local_60 = (ASN1_VALUE **)CONCAT71(local_60._1_7_,opt);
  local_78 = (code *)len;
  local_48 = pval;
  if (buf != (CRYPTO_BUFFER *)0x0) {
    puVar7 = CRYPTO_BUFFER_data(buf);
    if (*in < puVar7) {
LAB_00313751:
      __assert_fail("CRYPTO_BUFFER_data(buf) <= *in && *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0xa7,
                    "int asn1_item_ex_d2i(ASN1_VALUE **, const unsigned char **, long, const ASN1_ITEM *, int, int, char, CRYPTO_BUFFER *, int)"
                   );
    }
    puVar16 = *in + (long)local_78;
    puVar7 = CRYPTO_BUFFER_data(buf);
    sVar8 = CRYPTO_BUFFER_len(buf);
    if (puVar7 + sVar8 < puVar16) goto LAB_00313751;
  }
  ppAVar13 = (ASN1_VALUE **)local_48;
  if (0x3fffffff < (long)local_78) {
    local_78 = (code *)0x3fffffff;
  }
  if (depth < 0x1e) {
    if (5 < (byte)it->itype) {
      return 0;
    }
    iVar18 = depth + 1;
    switch(it->itype) {
    case '\0':
      if (it->templates == (ASN1_TEMPLATE *)0x0) {
        iVar18 = asn1_d2i_ex_primitive
                           (local_48,in,(long)local_78,it,(int)local_70,(int)local_50,(char)local_60
                           );
        return iVar18;
      }
      if ((int)local_70 == -1 && (char)local_60 == '\0') {
        iVar18 = asn1_template_ex_d2i(local_48,in,(long)local_78,it->templates,'\0',buf,iVar18);
        return iVar18;
      }
      pAVar17 = (ASN1_TEMPLATE *)0x0;
      iVar18 = 0x88;
      iVar4 = 0xbd;
      break;
    case '\x01':
      local_68 = (code *)*in;
      iVar4 = (int)local_50;
      if ((int)local_70 == -1) {
        iVar4 = 0;
      }
      iVar6 = 0x10;
      if ((int)local_70 != -1) {
        iVar6 = (int)local_70;
      }
      iVar4 = asn1_check_tlen((long *)&local_78,(int *)0x0,(uchar *)0x0,(char *)&local_54,
                              (uchar **)&local_68,(long)local_78,iVar6,iVar4,(char)local_60);
      if (iVar4 == -1) {
        return -1;
      }
      if (iVar4 == 0) {
        pAVar17 = (ASN1_TEMPLATE *)0x0;
        iVar18 = 0x9e;
        iVar4 = 0x143;
      }
      else if ((char)local_54 == '\0') {
        pAVar17 = (ASN1_TEMPLATE *)0x0;
        iVar18 = 0xa9;
        iVar4 = 0x149;
      }
      else {
        if (((ASN1_VALUE *)*ppAVar13 != (ASN1_VALUE *)0x0) ||
           (iVar4 = ASN1_item_ex_new(ppAVar13,(ASN1_ITEM *)it), iVar4 != 0)) {
          local_40 = buf;
          if (it->funcs == (void *)0x0) {
            pcVar15 = (code *)0x0;
          }
          else {
            pcVar15 = *(code **)((long)it->funcs + 0x10);
          }
          if (pcVar15 == (code *)0x0) {
LAB_0031335d:
            local_70 = in;
            local_58 = iVar18;
            if (0 < it->tcount) {
              pAVar17 = (ASN1_TEMPLATE *)it->templates;
              lVar14 = 0;
              do {
                if (((pAVar17->flags & 0x300) != 0) &&
                   (pAVar11 = asn1_do_adb(ppAVar13,pAVar17,0), pAVar11 != (ASN1_TEMPLATE *)0x0)) {
                  ppAVar9 = asn1_get_field_ptr(ppAVar13,pAVar11);
                  ASN1_template_free(ppAVar9,pAVar11);
                }
                lVar14 = lVar14 + 1;
                pAVar17 = (ASN1_TEMPLATE *)&pAVar17->item;
              } while (lVar14 < it->tcount);
            }
            pAVar11 = (ASN1_TEMPLATE *)it->templates;
            local_38 = pcVar15;
            if (it->tcount < 1) {
              uVar10 = 0;
              pAVar17 = (ASN1_TEMPLATE *)0x0;
            }
            else {
              uVar10 = 0;
              pAVar17 = (ASN1_TEMPLATE *)0x0;
              do {
                pAVar12 = asn1_do_adb(ppAVar13,pAVar11,1);
                iVar4 = 2;
                if (pAVar12 != (ASN1_TEMPLATE *)0x0) {
                  ppAVar9 = asn1_get_field_ptr(ppAVar13,pAVar12);
                  if (local_78 == (code *)0x0) {
                    iVar4 = 0xb;
                  }
                  else {
                    if (uVar10 == it->tcount - 1U) {
                      opt_00 = 0;
                    }
                    else {
                      opt_00 = (byte)pAVar12->flags & 1;
                    }
                    local_50 = local_68;
                    local_60 = ppAVar9;
                    iVar18 = asn1_template_ex_d2i
                                       ((ASN1_VALUE **)ppAVar9,(uchar **)&local_68,(long)local_78,
                                        (ASN1_TEMPLATE *)pAVar12,opt_00,local_40,local_58);
                    if (iVar18 == 0) {
                      iVar4 = 2;
                      pAVar17 = pAVar12;
                    }
                    else if (iVar18 == -1) {
                      ASN1_template_free(local_60,pAVar12);
                      iVar4 = 0xd;
                    }
                    else {
                      local_78 = local_50 + ((long)local_78 - (long)local_68);
                      iVar4 = 0;
                    }
                  }
                }
                if ((iVar4 != 0) && (iVar4 != 0xd)) {
                  if (iVar4 != 0xb) goto LAB_003134e1;
                  break;
                }
                uVar10 = uVar10 + 1;
                pAVar11 = (ASN1_TEMPLATE *)&pAVar11->item;
              } while ((long)uVar10 < it->tcount);
            }
            if (local_78 == (code *)0x0) {
              uVar10 = uVar10 & 0xffffffff;
              if ((long)uVar10 < it->tcount) {
                do {
                  pAVar12 = asn1_do_adb(ppAVar13,pAVar11,1);
                  iVar4 = 2;
                  if (pAVar12 == (ASN1_TEMPLATE *)0x0) {
                    bVar2 = false;
                  }
                  else if ((pAVar12->flags & 1) == 0) {
                    bVar2 = false;
                    ERR_put_error(0xc,0,0x79,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                                  ,0x1a1);
                    iVar4 = 2;
                    pAVar17 = pAVar12;
                  }
                  else {
                    ppAVar13 = asn1_get_field_ptr(ppAVar13,pAVar12);
                    ASN1_template_free(ppAVar13,pAVar12);
                    iVar4 = 0;
                    bVar2 = true;
                  }
                  ppAVar13 = (ASN1_VALUE **)local_48;
                  if (!bVar2) goto LAB_003134e1;
                  pAVar11 = (ASN1_TEMPLATE *)&pAVar11->item;
                  uVar10 = uVar10 + 1;
                } while ((long)uVar10 < it->tcount);
              }
              ppuVar3 = local_70;
              iVar18 = asn1_enc_save(ppAVar13,*local_70,(int)local_68 - (int)*local_70,
                                     (ASN1_ITEM *)it);
              iVar4 = 4;
              if (iVar18 != 0) {
                if ((local_38 == (code *)0x0) ||
                   (iVar18 = (*local_38)(5,ppAVar13,it,0), iVar18 != 0)) {
                  *ppuVar3 = (uchar *)local_68;
                  iVar4 = 1;
                }
                else {
                  iVar4 = 4;
                }
              }
            }
            else {
              ERR_put_error(0xc,0,0xa8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                            ,0x18e);
              iVar4 = 2;
            }
          }
          else {
            pAVar17 = (ASN1_TEMPLATE *)0x0;
            iVar6 = (*pcVar15)(4,ppAVar13,it,0);
            iVar4 = 4;
            if (iVar6 != 0) goto LAB_0031335d;
          }
LAB_003134e1:
          if (iVar4 == 2) goto LAB_003136af;
          iVar18 = 1;
          goto joined_r0x0031368f;
        }
        pAVar17 = (ASN1_TEMPLATE *)0x0;
        iVar18 = 0x9e;
        iVar4 = 0x14e;
      }
      break;
    case '\x02':
      if ((int)local_70 == -1) {
        if (it->funcs == (void *)0x0) {
          pcVar15 = (code *)0x0;
        }
        else {
          pcVar15 = *(code **)((long)it->funcs + 0x10);
        }
        local_70 = in;
        local_58 = iVar18;
        if (pcVar15 == (code *)0x0) {
LAB_00313151:
          if ((ASN1_VALUE *)*ppAVar13 == (ASN1_VALUE *)0x0) {
            iVar18 = ASN1_item_ex_new(ppAVar13,(ASN1_ITEM *)it);
            if (iVar18 != 0) goto LAB_00313202;
            pAVar17 = (ASN1_TEMPLATE *)0x0;
            iVar18 = 0x9e;
            iVar4 = 0x10d;
LAB_0031367a:
            ERR_put_error(0xc,0,iVar18,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                          ,iVar4);
            iVar4 = 2;
          }
          else {
            uVar5 = asn1_get_choice_selector(ppAVar13,(ASN1_ITEM *)it);
            if ((-1 < (int)uVar5) && ((long)(ulong)uVar5 < it->tcount)) {
              pAVar1 = it->templates;
              ppAVar9 = asn1_get_field_ptr(ppAVar13,(ASN1_TEMPLATE *)(pAVar1 + uVar5));
              ASN1_template_free(ppAVar9,(ASN1_TEMPLATE *)(pAVar1 + uVar5));
              asn1_set_choice_selector(ppAVar13,-1,(ASN1_ITEM *)it);
            }
LAB_00313202:
            local_68 = (code *)*local_70;
            local_50 = pcVar15;
            if (it->tcount < 1) {
              iVar18 = 0;
              pcVar15 = (code *)0x0;
            }
            else {
              pAVar17 = (ASN1_TEMPLATE *)it->templates;
              pcVar15 = (code *)0x0;
              do {
                ppAVar9 = asn1_get_field_ptr(ppAVar13,pAVar17);
                iVar18 = asn1_template_ex_d2i
                                   ((ASN1_VALUE **)ppAVar9,(uchar **)&local_68,(long)local_78,
                                    (ASN1_TEMPLATE *)pAVar17,'\x01',buf,local_58);
                if (iVar18 != -1) {
                  if (iVar18 < 1) {
                    iVar18 = 0x9e;
                    iVar4 = 0x120;
                    goto LAB_0031367a;
                  }
                  break;
                }
                pcVar15 = pcVar15 + 1;
                pAVar17 = (ASN1_TEMPLATE *)&pAVar17->item;
              } while ((long)pcVar15 < it->tcount);
              iVar18 = (int)pcVar15;
            }
            if ((code *)it->tcount == pcVar15) {
              if ((char)local_60 == '\0') {
                pAVar17 = (ASN1_TEMPLATE *)0x0;
                iVar18 = 0xa3;
                iVar4 = 300;
                goto LAB_0031367a;
              }
              ASN1_item_ex_free(ppAVar13,(ASN1_ITEM *)it);
              pcVar15 = (code *)&DAT_ffffffff;
              iVar4 = 1;
              pAVar17 = (ASN1_TEMPLATE *)0x0;
            }
            else {
              asn1_set_choice_selector(ppAVar13,iVar18,(ASN1_ITEM *)it);
              if (local_50 != (code *)0x0) {
                pAVar17 = (ASN1_TEMPLATE *)0x0;
                iVar18 = (*local_50)(5,ppAVar13,it,0);
                if (iVar18 == 0) {
                  iVar4 = 4;
                  goto LAB_00313685;
                }
              }
              *local_70 = (uchar *)local_68;
              iVar4 = 1;
              pAVar17 = (ASN1_TEMPLATE *)0x0;
              pcVar15 = (code *)0x1;
            }
          }
        }
        else {
          pAVar17 = (ASN1_TEMPLATE *)0x0;
          iVar4 = 4;
          iVar18 = (*pcVar15)(4,local_48,it,0);
          if (iVar18 != 0) goto LAB_00313151;
        }
LAB_00313685:
        iVar18 = (int)pcVar15;
        if (iVar4 == 2) goto LAB_003136af;
joined_r0x0031368f:
        if (iVar4 != 4) {
          return iVar18;
        }
        iVar18 = 0x65;
        iVar4 = 0x1b4;
      }
      else {
        pAVar17 = (ASN1_TEMPLATE *)0x0;
        iVar18 = 0xc1;
        iVar4 = 0xf9;
      }
      break;
    case '\x03':
      goto LAB_00313702;
    case '\x04':
      if ((int)local_70 == -1) {
        iVar18 = (**(code **)((long)it->funcs + 0x10))
                           (local_48,in,local_78,it,(int)(char)local_60,0);
        return iVar18;
      }
      pAVar17 = (ASN1_TEMPLATE *)0x0;
      iVar18 = 0xc1;
      iVar4 = 0xed;
      break;
    case '\x05':
      if ((int)local_70 == -1) {
        local_68 = (code *)*in;
        iVar18 = asn1_check_tlen((long *)0x0,&local_54,&local_79,(char *)0x0,(uchar **)&local_68,
                                 (long)local_78,-1,0,'\x01');
        if (iVar18 == 0) {
          pAVar17 = (ASN1_TEMPLATE *)0x0;
          iVar18 = 0x9e;
          iVar4 = 0xd2;
        }
        else if (local_79 == '\0') {
          uVar10 = ASN1_tag2bit(local_54);
          if ((it->utype & (uint)uVar10) != 0) {
            iVar18 = asn1_d2i_ex_primitive
                               ((ASN1_VALUE **)ppAVar13,in,(long)local_78,it,local_54,0,'\0');
            return iVar18;
          }
          if ((char)local_60 != '\0') {
            return -1;
          }
          pAVar17 = (ASN1_TEMPLATE *)0x0;
          iVar18 = 0x9d;
          iVar4 = 0xe5;
        }
        else {
          if ((char)local_60 != '\0') {
            return -1;
          }
          pAVar17 = (ASN1_TEMPLATE *)0x0;
          iVar18 = 0x9c;
          iVar4 = 0xdc;
        }
      }
      else {
        pAVar17 = (ASN1_TEMPLATE *)0x0;
        iVar18 = 0xc1;
        iVar4 = 0xca;
      }
    }
    ERR_put_error(0xc,0,iVar18,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar4);
  }
  else {
    pAVar17 = (ASN1_TEMPLATE *)0x0;
    ERR_put_error(0xc,0,0xc0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0xb1);
    ppAVar13 = (ASN1_VALUE **)local_48;
  }
LAB_003136af:
  ASN1_item_ex_free(ppAVar13,(ASN1_ITEM *)it);
  if (pAVar17 == (ASN1_TEMPLATE *)0x0) {
    ERR_add_error_data(2,"Type=",it->sname);
  }
  else {
    ERR_add_error_data(4,"Field=",pAVar17->offset,", Type=",it->sname);
  }
LAB_00313702:
  return 0;
}

Assistant:

static int asn1_item_ex_d2i(ASN1_VALUE **pval, const unsigned char **in,
                            long len, const ASN1_ITEM *it, int tag, int aclass,
                            char opt, CRYPTO_BUFFER *buf, int depth) {
  const ASN1_TEMPLATE *tt, *errtt = NULL;
  const unsigned char *p = NULL, *q;
  unsigned char oclass;
  char cst, isopt;
  int i;
  int otag;
  int ret = 0;
  ASN1_VALUE **pchptr;
  if (!pval) {
    return 0;
  }

  if (buf != NULL) {
    assert(CRYPTO_BUFFER_data(buf) <= *in &&
           *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf));
  }

  // Bound |len| to comfortably fit in an int. Lengths in this module often
  // switch between int and long without overflow checks.
  if (len > INT_MAX / 2) {
    len = INT_MAX / 2;
  }

  if (++depth > ASN1_MAX_CONSTRUCTED_NEST) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_TOO_DEEP);
    goto err;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        // tagging or OPTIONAL is currently illegal on an item template
        // because the flags can't get passed down. In practice this
        // isn't a problem: we include the relevant flags from the item
        // template in the template itself.
        if ((tag != -1) || opt) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OPTIONS_ON_ITEM_TEMPLATE);
          goto err;
        }
        return asn1_template_ex_d2i(pval, in, len, it->templates, opt, buf,
                                    depth);
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, tag, aclass, opt);
      break;

    case ASN1_ITYPE_MSTRING:
      // It never makes sense for multi-strings to have implicit tagging, so
      // if tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      p = *in;
      // Just read in tag and class
      ret = asn1_check_tlen(NULL, &otag, &oclass, NULL, &p, len, -1, 0, 1);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Must be UNIVERSAL class
      if (oclass != V_ASN1_UNIVERSAL) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_NOT_UNIVERSAL);
        goto err;
      }
      // Check tag matches bit map
      if (!(ASN1_tag2bit(otag) & it->utype)) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_WRONG_TAG);
        goto err;
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, otag, 0, 0);

    case ASN1_ITYPE_EXTERN: {
      // We don't support implicit tagging with external types.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      return ef->asn1_ex_d2i(pval, in, len, it, opt, NULL);
    }

    case ASN1_ITYPE_CHOICE: {
      // It never makes sense for CHOICE types to have implicit tagging, so if
      // tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      if (*pval) {
        // Free up and zero CHOICE value if initialised
        i = asn1_get_choice_selector(pval, it);
        if ((i >= 0) && (i < it->tcount)) {
          tt = it->templates + i;
          pchptr = asn1_get_field_ptr(pval, tt);
          ASN1_template_free(pchptr, tt);
          asn1_set_choice_selector(pval, -1, it);
        }
      } else if (!ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }
      // CHOICE type, try each possibility in turn
      p = *in;
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        pchptr = asn1_get_field_ptr(pval, tt);
        // We mark field as OPTIONAL so its absence can be recognised.
        ret = asn1_template_ex_d2i(pchptr, &p, len, tt, 1, buf, depth);
        // If field not present, try the next one
        if (ret == -1) {
          continue;
        }
        // If positive return, read OK, break loop
        if (ret > 0) {
          break;
        }
        // Otherwise must be an ASN1 parsing error
        errtt = tt;
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Did we fall off the end without reading anything?
      if (i == it->tcount) {
        // If OPTIONAL, this is OK
        if (opt) {
          // Free and zero it
          ASN1_item_ex_free(pval, it);
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NO_MATCHING_CHOICE_TYPE);
        goto err;
      }

      asn1_set_choice_selector(pval, i, it);
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    case ASN1_ITYPE_SEQUENCE: {
      p = *in;

      // If no IMPLICIT tagging set to SEQUENCE, UNIVERSAL
      if (tag == -1) {
        tag = V_ASN1_SEQUENCE;
        aclass = V_ASN1_UNIVERSAL;
      }
      // Get SEQUENCE length and update len, p
      ret = asn1_check_tlen(&len, NULL, NULL, &cst, &p, len, tag, aclass, opt);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      } else if (ret == -1) {
        return -1;
      }
      if (!cst) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_NOT_CONSTRUCTED);
        goto err;
      }

      if (!*pval && !ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      // Free up and zero any ADB found
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        if (tt->flags & ASN1_TFLG_ADB_MASK) {
          const ASN1_TEMPLATE *seqtt;
          ASN1_VALUE **pseqval;
          seqtt = asn1_do_adb(pval, tt, 0);
          if (seqtt == NULL) {
            continue;
          }
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        }
      }

      // Get each field entry
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        // Have we ran out of data?
        if (!len) {
          break;
        }
        q = p;
        // This determines the OPTIONAL flag value. The field cannot be
        // omitted if it is the last of a SEQUENCE and there is still
        // data to be read. This isn't strictly necessary but it
        // increases efficiency in some cases.
        if (i == (it->tcount - 1)) {
          isopt = 0;
        } else {
          isopt = (seqtt->flags & ASN1_TFLG_OPTIONAL) != 0;
        }
        // attempt to read in field, allowing each to be OPTIONAL

        ret = asn1_template_ex_d2i(pseqval, &p, len, seqtt, isopt, buf, depth);
        if (!ret) {
          errtt = seqtt;
          goto err;
        } else if (ret == -1) {
          // OPTIONAL component absent. Free and zero the field.
          ASN1_template_free(pseqval, seqtt);
          continue;
        }
        // Update length
        len -= p - q;
      }

      // Check all data read
      if (len) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_LENGTH_MISMATCH);
        goto err;
      }

      // If we get here we've got no more data in the SEQUENCE, however we
      // may not have read all fields so check all remaining are OPTIONAL
      // and clear any that are.
      for (; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        if (seqtt->flags & ASN1_TFLG_OPTIONAL) {
          ASN1_VALUE **pseqval;
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        } else {
          errtt = seqtt;
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_FIELD_MISSING);
          goto err;
        }
      }
      // Save encoding
      if (!asn1_enc_save(pval, *in, p - *in, it, buf)) {
        goto auxerr;
      }
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    default:
      return 0;
  }
auxerr:
  OPENSSL_PUT_ERROR(ASN1, ASN1_R_AUX_ERROR);
err:
  ASN1_item_ex_free(pval, it);
  if (errtt) {
    ERR_add_error_data(4, "Field=", errtt->field_name, ", Type=", it->sname);
  } else {
    ERR_add_error_data(2, "Type=", it->sname);
  }
  return 0;
}